

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

ostream * ClipperLib::operator<<(ostream *s,IntPoint *p)

{
  undefined8 in_RAX;
  ostream *poVar1;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  poVar1 = std::ostream::_M_insert<long_long>((longlong)s);
  uStack_18 = CONCAT17(0x20,(undefined7)uStack_18);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)((long)&uStack_18 + 7),1);
  poVar1 = std::ostream::_M_insert<long_long>((longlong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return s;
}

Assistant:

std::ostream& operator <<(std::ostream &s, IntPoint& p)
{
  s << p.X << ' ' << p.Y << "\n";
  return s;
}